

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O2

void Mem_StepStop(Mem_Step_t *p,int fVerbose)

{
  void **__ptr;
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < p->nMems; lVar1 = lVar1 + 1) {
    Mem_FixedStop(p->pMems[lVar1],fVerbose);
  }
  if (p->pLargeChunks != (void **)0x0) {
    for (lVar1 = 0; __ptr = p->pLargeChunks, lVar1 < p->nLargeChunks; lVar1 = lVar1 + 1) {
      if (__ptr[lVar1] != (void *)0x0) {
        free(__ptr[lVar1]);
        p->pLargeChunks[lVar1] = (void *)0x0;
      }
    }
    if (__ptr != (void **)0x0) {
      free(__ptr);
      p->pLargeChunks = (void **)0x0;
    }
  }
  if (p->pMems != (Mem_Fixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Mem_Fixed_t **)0x0;
  }
  free(p->pMap);
  free(p);
  return;
}

Assistant:

void Mem_StepStop( Mem_Step_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Mem_FixedStop( p->pMems[i], fVerbose );
    if ( p->pLargeChunks ) 
    {
        for ( i = 0; i < p->nLargeChunks; i++ )
            ABC_FREE( p->pLargeChunks[i] );
        ABC_FREE( p->pLargeChunks );
    }
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}